

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O0

ma_result ma_linear_resampler_get_required_input_frame_count
                    (ma_linear_resampler *pResampler,ma_uint64 outputFrameCount,
                    ma_uint64 *pInputFrameCount)

{
  ma_uint64 inputFrameCount;
  ma_uint64 *pInputFrameCount_local;
  ma_uint64 outputFrameCount_local;
  ma_linear_resampler *pResampler_local;
  
  if (pInputFrameCount == (ma_uint64 *)0x0) {
    pResampler_local._4_4_ = MA_INVALID_ARGS;
  }
  else {
    *pInputFrameCount = 0;
    if (pResampler == (ma_linear_resampler *)0x0) {
      pResampler_local._4_4_ = MA_INVALID_ARGS;
    }
    else if (outputFrameCount == 0) {
      pResampler_local._4_4_ = MA_SUCCESS;
    }
    else {
      *pInputFrameCount =
           ((ulong)pResampler->inTimeFrac +
           (outputFrameCount - 1) * (ulong)pResampler->inAdvanceFrac) /
           (ulong)(pResampler->config).sampleRateOut +
           (outputFrameCount - 1) * (ulong)pResampler->inAdvanceInt + (ulong)pResampler->inTimeInt;
      pResampler_local._4_4_ = MA_SUCCESS;
    }
  }
  return pResampler_local._4_4_;
}

Assistant:

MA_API ma_result ma_linear_resampler_get_required_input_frame_count(const ma_linear_resampler* pResampler, ma_uint64 outputFrameCount, ma_uint64* pInputFrameCount)
{
    ma_uint64 inputFrameCount;

    if (pInputFrameCount == NULL) {
        return MA_INVALID_ARGS;
    }

    *pInputFrameCount = 0;

    if (pResampler == NULL) {
        return MA_INVALID_ARGS;
    }

    if (outputFrameCount == 0) {
        return MA_SUCCESS;
    }

    /* Any whole input frames are consumed before the first output frame is generated. */
    inputFrameCount = pResampler->inTimeInt;
    outputFrameCount -= 1;

    /* The rest of the output frames can be calculated in constant time. */
    inputFrameCount += outputFrameCount * pResampler->inAdvanceInt;
    inputFrameCount += (pResampler->inTimeFrac + (outputFrameCount * pResampler->inAdvanceFrac)) / pResampler->config.sampleRateOut;

    *pInputFrameCount = inputFrameCount;

    return MA_SUCCESS;
}